

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp.c
# Opt level: O3

int comp_method_none_decomp
              (LIBSSH2_SESSION *session,uchar **dest,size_t *dest_len,size_t payload_limit,
              uchar *src,size_t src_len,void **abstract)

{
  return 0;
}

Assistant:

static int
comp_method_none_decomp(LIBSSH2_SESSION * session,
                        unsigned char **dest,
                        size_t *dest_len,
                        size_t payload_limit,
                        const unsigned char *src,
                        size_t src_len, void **abstract)
{
    (void)session;
    (void)dest;
    (void)dest_len;
    (void)payload_limit;
    (void)src;
    (void)src_len;
    (void)abstract;

    return 0;
}